

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

int luaO_str2d(char *s,lua_Number *result)

{
  byte *pbVar1;
  uint uVar2;
  ulong uVar3;
  ushort **ppuVar4;
  double dVar5;
  undefined1 auVar6 [16];
  byte *local_20;
  
  dVar5 = strtod(s,(char **)&local_20);
  *result = dVar5;
  if (local_20 == (byte *)s) {
    uVar2 = 0;
  }
  else {
    if ((*local_20 | 0x20) == 0x78) {
      uVar3 = strtoul(s,(char **)&local_20,0x10);
      auVar6._8_4_ = (int)(uVar3 >> 0x20);
      auVar6._0_8_ = uVar3;
      auVar6._12_4_ = 0x45300000;
      *result = (auVar6._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0);
    }
    if (*local_20 == 0) {
      uVar2 = 1;
    }
    else {
      ppuVar4 = __ctype_b_loc();
      local_20 = local_20 + -1;
      do {
        pbVar1 = local_20 + 1;
        local_20 = local_20 + 1;
      } while ((*(byte *)((long)*ppuVar4 + (ulong)*pbVar1 * 2 + 1) & 0x20) != 0);
      uVar2 = (uint)(*pbVar1 == 0);
    }
  }
  return uVar2;
}

Assistant:

static int luaO_str2d(const char*s,lua_Number*result){
char*endptr;
*result=lua_str2number(s,&endptr);
if(endptr==s)return 0;
if(*endptr=='x'||*endptr=='X')
*result=cast_num(strtoul(s,&endptr,16));
if(*endptr=='\0')return 1;
while(isspace(cast(unsigned char,*endptr)))endptr++;
if(*endptr!='\0')return 0;
return 1;
}